

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

size_t __thiscall google::protobuf::FileOptions::ByteSizeLong(FileOptions *this)

{
  bool bVar1;
  uint uVar2;
  FileOptions_OptimizeMode value;
  int iVar3;
  UnknownFieldSet *unknown_fields;
  size_t sVar4;
  UninterpretedOption *value_00;
  string *psVar5;
  uint local_50;
  int cached_size;
  uint i;
  uint count;
  size_t total_size;
  FileOptions *this_local;
  
  _i = internal::ExtensionSet::ByteSize(&this->_extensions_);
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = FileOptions::unknown_fields(this);
    sVar4 = internal::WireFormat::ComputeUnknownFieldsSize(unknown_fields);
    _i = sVar4 + _i;
  }
  uVar2 = uninterpreted_option_size(this);
  _i = (ulong)uVar2 * 2 + _i;
  for (local_50 = 0; local_50 < uVar2; local_50 = local_50 + 1) {
    value_00 = uninterpreted_option(this,local_50);
    sVar4 = internal::WireFormatLite::MessageSizeNoVirtual<google::protobuf::UninterpretedOption>
                      (value_00);
    _i = sVar4 + _i;
  }
  if (((this->_has_bits_).has_bits_[0] & 0xff) != 0) {
    bVar1 = has_java_package(this);
    if (bVar1) {
      psVar5 = java_package_abi_cxx11_(this);
      sVar4 = internal::WireFormatLite::StringSize(psVar5);
      _i = sVar4 + 1 + _i;
    }
    bVar1 = has_java_outer_classname(this);
    if (bVar1) {
      psVar5 = java_outer_classname_abi_cxx11_(this);
      sVar4 = internal::WireFormatLite::StringSize(psVar5);
      _i = sVar4 + 1 + _i;
    }
    bVar1 = has_go_package(this);
    if (bVar1) {
      psVar5 = go_package_abi_cxx11_(this);
      sVar4 = internal::WireFormatLite::StringSize(psVar5);
      _i = sVar4 + 1 + _i;
    }
    bVar1 = has_objc_class_prefix(this);
    if (bVar1) {
      psVar5 = objc_class_prefix_abi_cxx11_(this);
      sVar4 = internal::WireFormatLite::StringSize(psVar5);
      _i = sVar4 + 2 + _i;
    }
    bVar1 = has_csharp_namespace(this);
    if (bVar1) {
      psVar5 = csharp_namespace_abi_cxx11_(this);
      sVar4 = internal::WireFormatLite::StringSize(psVar5);
      _i = sVar4 + 2 + _i;
    }
    bVar1 = has_swift_prefix(this);
    if (bVar1) {
      psVar5 = swift_prefix_abi_cxx11_(this);
      sVar4 = internal::WireFormatLite::StringSize(psVar5);
      _i = sVar4 + 2 + _i;
    }
    bVar1 = has_php_class_prefix(this);
    if (bVar1) {
      psVar5 = php_class_prefix_abi_cxx11_(this);
      sVar4 = internal::WireFormatLite::StringSize(psVar5);
      _i = sVar4 + 2 + _i;
    }
    bVar1 = has_java_multiple_files(this);
    if (bVar1) {
      _i = _i + 2;
    }
  }
  if (((this->_has_bits_).has_bits_[0] & 0xff00) != 0) {
    bVar1 = has_java_generate_equals_and_hash(this);
    if (bVar1) {
      _i = _i + 3;
    }
    bVar1 = has_java_string_check_utf8(this);
    if (bVar1) {
      _i = _i + 3;
    }
    bVar1 = has_cc_generic_services(this);
    if (bVar1) {
      _i = _i + 3;
    }
    bVar1 = has_java_generic_services(this);
    if (bVar1) {
      _i = _i + 3;
    }
    bVar1 = has_py_generic_services(this);
    if (bVar1) {
      _i = _i + 3;
    }
    bVar1 = has_deprecated(this);
    if (bVar1) {
      _i = _i + 3;
    }
    bVar1 = has_cc_enable_arenas(this);
    if (bVar1) {
      _i = _i + 3;
    }
    bVar1 = has_optimize_for(this);
    if (bVar1) {
      value = optimize_for(this);
      sVar4 = internal::WireFormatLite::EnumSize(value);
      _i = sVar4 + 1 + _i;
    }
  }
  iVar3 = internal::ToCachedSize(_i);
  this->_cached_size_ = iVar3;
  return _i;
}

Assistant:

size_t FileOptions::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.FileOptions)
  size_t total_size = 0;

  total_size += _extensions_.ByteSize();

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  {
    unsigned int count = this->uninterpreted_option_size();
    total_size += 2UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->uninterpreted_option(i));
    }
  }

  if (_has_bits_[0 / 32] & 255u) {
    // optional string java_package = 1;
    if (has_java_package()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->java_package());
    }

    // optional string java_outer_classname = 8;
    if (has_java_outer_classname()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->java_outer_classname());
    }

    // optional string go_package = 11;
    if (has_go_package()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->go_package());
    }

    // optional string objc_class_prefix = 36;
    if (has_objc_class_prefix()) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->objc_class_prefix());
    }

    // optional string csharp_namespace = 37;
    if (has_csharp_namespace()) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->csharp_namespace());
    }

    // optional string swift_prefix = 39;
    if (has_swift_prefix()) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->swift_prefix());
    }

    // optional string php_class_prefix = 40;
    if (has_php_class_prefix()) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->php_class_prefix());
    }

    // optional bool java_multiple_files = 10 [default = false];
    if (has_java_multiple_files()) {
      total_size += 1 + 1;
    }

  }
  if (_has_bits_[8 / 32] & 65280u) {
    // optional bool java_generate_equals_and_hash = 20 [deprecated = true];
    if (has_java_generate_equals_and_hash()) {
      total_size += 2 + 1;
    }

    // optional bool java_string_check_utf8 = 27 [default = false];
    if (has_java_string_check_utf8()) {
      total_size += 2 + 1;
    }

    // optional bool cc_generic_services = 16 [default = false];
    if (has_cc_generic_services()) {
      total_size += 2 + 1;
    }

    // optional bool java_generic_services = 17 [default = false];
    if (has_java_generic_services()) {
      total_size += 2 + 1;
    }

    // optional bool py_generic_services = 18 [default = false];
    if (has_py_generic_services()) {
      total_size += 2 + 1;
    }

    // optional bool deprecated = 23 [default = false];
    if (has_deprecated()) {
      total_size += 2 + 1;
    }

    // optional bool cc_enable_arenas = 31 [default = false];
    if (has_cc_enable_arenas()) {
      total_size += 2 + 1;
    }

    // optional .google.protobuf.FileOptions.OptimizeMode optimize_for = 9 [default = SPEED];
    if (has_optimize_for()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::EnumSize(this->optimize_for());
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}